

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O1

void __thiscall
HighsCliqueTable::runCliqueMerging
          (HighsCliqueTable *this,HighsDomain *globaldomain,
          vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *clique,
          bool equation)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  double *pdVar1;
  double dVar2;
  int iVar3;
  CliqueVar CVar4;
  pointer pdVar5;
  pointer pdVar6;
  HighsInt HVar7;
  pointer pCVar8;
  pointer pCVar9;
  ulong uVar10;
  pointer pCVar11;
  CliqueVar *pCVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  CliqueVar CVar18;
  HighsCliqueTable *pHVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  bool bVar24;
  vector<int,_std::allocator<int>_> neighbourhoodInds;
  anon_class_24_3_c8bba91f addCands;
  anon_class_8_1_9cafd1bc local_70;
  vector<int,_std::allocator<int>_> local_68;
  anon_class_24_3_c8bba91f local_48;
  
  this_00 = &this->iscandidate;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (this_00,(long)(this->invertedHashList).
                           super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->invertedHashList).
                           super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            (&local_68,
             (long)(this->invertedHashList).
                   super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->invertedHashList).
                   super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  pCVar9 = (clique->
           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pCVar8 = (clique->
           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar14 = (long)pCVar8 - (long)pCVar9;
  uVar15 = (long)uVar14 >> 2;
  iVar13 = (int)uVar15;
  pHVar19 = this;
  if (iVar13 == 0) {
    bVar24 = true;
  }
  else {
    iVar16 = 0x7fffffff;
    uVar17 = 0;
    do {
      uVar22 = (uint)(this->cliqueentries).
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar17] & 0x7fffffff;
      dVar2 = (globaldomain->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_start[uVar22];
      pdVar1 = (globaldomain->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar22;
      if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
        CVar18 = pCVar9[uVar17];
        iVar3 = (this->numcliquesvar).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(int)((int)CVar18 << 1 | (uint)((int)CVar18 < 0))];
        pHVar19 = (HighsCliqueTable *)((ulong)pHVar19 & 0xffffffff);
        if (iVar3 < iVar16) {
          pHVar19 = (HighsCliqueTable *)(ulong)(uint)CVar18;
          iVar16 = iVar3;
        }
      }
      uVar17 = uVar17 + 1;
    } while ((uVar15 & 0xffffffff) != uVar17);
    bVar24 = iVar16 == 0x7fffffff;
  }
  if (bVar24) {
    if (pCVar8 != pCVar9) {
      (clique->
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>)
      ._M_impl.super__Vector_impl_data._M_finish = pCVar9;
    }
    goto LAB_00266e7c;
  }
  if (iVar13 != 0) {
    uVar17 = 0;
    do {
      CVar18 = (clique->
               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
               )._M_impl.super__Vector_impl_data._M_start[uVar17];
      (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start[(int)((int)CVar18 << 1 | (uint)((int)CVar18 < 0))] = '\x01';
      uVar17 = uVar17 + 1;
    } while ((uVar15 & 0xffffffff) != uVar17);
  }
  local_70.addCands = &local_48;
  CVar18 = SUB84(pHVar19,0);
  uVar22 = (int)CVar18 << 1 | (uint)((int)CVar18 < 0);
  local_48.this = this;
  local_48.globaldomain = globaldomain;
  local_48.clique = clique;
  HighsHashTree<int,_int>::
  for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:2001:7)_&,_0>
            ((NodePtr)(this->invertedHashList).
                      super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(int)uVar22].root.ptrAndType,
             &local_70);
  local_70.addCands = &local_48;
  HighsHashTree<int,_void>::
  for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:2004:7)_&,_0>
            ((NodePtr)(this->invertedHashListSizeTwo).
                      super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(int)uVar22].root.ptrAndType,
             &local_70);
  uVar17 = (ulong)((long)(clique->
                         super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(clique->
                        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        )._M_impl.super__Vector_impl_data._M_start) >> 2;
  if ((int)uVar17 != 0) {
    uVar10 = 0;
    do {
      CVar4 = (clique->
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              )._M_impl.super__Vector_impl_data._M_start[uVar10];
      (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start[(int)((int)CVar4 << 1 | (uint)((int)CVar4 < 0))] = '\0';
      uVar10 = uVar10 + 1;
    } while ((uVar17 & 0xffffffff) != uVar10);
  }
  if (iVar13 != 0) {
    uVar17 = 0;
    do {
      pCVar9 = (clique->
               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
               )._M_impl.super__Vector_impl_data._M_start;
      iVar16 = (int)((long)(clique->
                           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar9 >> 2);
      if (iVar16 <= iVar13) break;
      if (pCVar9[uVar17] != CVar18) {
        HVar7 = shrinkToNeighbourhood
                          (this,&local_68,&this->numNeighbourhoodQueries,pCVar9[uVar17],
                           (CliqueVar *)(&pCVar9->field_0x0 + ((long)(uVar14 * 0x40000000) >> 0x1e))
                           ,iVar16 - iVar13);
        pCVar8 = (clique->
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 )._M_impl.super__Vector_impl_data._M_start + (HVar7 + iVar13);
        pCVar9 = (clique->
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if ((pCVar8 != pCVar9) &&
           (pCVar11 = (clique->
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      )._M_impl.super__Vector_impl_data._M_finish,
           pCVar8 = (pointer)((long)pCVar8 + ((long)pCVar11 - (long)pCVar9)), pCVar11 != pCVar8)) {
          (clique->
          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
          )._M_impl.super__Vector_impl_data._M_finish = pCVar8;
        }
      }
      uVar17 = uVar17 + 1;
    } while ((uVar15 & 0xffffffff) != uVar17);
  }
  uVar22 = (uint)(uVar14 >> 2);
  pCVar9 = (clique->
           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar14 = (long)(clique->
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar9 >> 2;
  if ((ulong)(long)(int)uVar22 < uVar14) {
    HighsRandom::shuffle<HighsCliqueTable::CliqueVar>
              (&this->randgen,pCVar9 + (int)uVar22,(int)uVar14 - iVar13);
    pCVar9 = (clique->
             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar14 = (ulong)((long)(clique->
                           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar9) >> 2;
    if (iVar13 < (int)uVar14) {
      lVar20 = (long)(int)uVar22;
      uVar23 = ~uVar22;
      lVar21 = lVar20 * 4;
      do {
        HVar7 = shrinkToNeighbourhood
                          (this,&local_68,&this->numNeighbourhoodQueries,pCVar9[lVar20],
                           (CliqueVar *)(&pCVar9[1].field_0x0 + lVar21),(int)uVar14 + uVar23);
        pCVar9 = (clique->
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pCVar8 = (clique->
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (((pointer)(&pCVar9[(long)HVar7 + 1].field_0x0 + lVar21) != pCVar8) &&
           (pCVar11 = (clique->
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      )._M_impl.super__Vector_impl_data._M_finish,
           pCVar9 = (pointer)((long)pCVar11 +
                             (long)pCVar9 + ((lVar21 + 4) - (long)pCVar8) + (long)HVar7 * 4),
           pCVar9 != pCVar11)) {
          (clique->
          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
          )._M_impl.super__Vector_impl_data._M_finish = pCVar9;
        }
        lVar20 = lVar20 + 1;
        pCVar9 = (clique->
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar14 = (ulong)((long)(clique->
                               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar9) >> 2;
        uVar23 = uVar23 - 1;
        lVar21 = lVar21 + 4;
      } while (lVar20 < (int)uVar14);
    }
  }
  if (equation) {
    pCVar9 = (clique->
             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (iVar13 < (int)((ulong)((long)(clique->
                                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar9) >>
                      2)) {
      lVar21 = (long)(int)uVar22;
      do {
        vertexInfeasible(this,globaldomain,(uint)pCVar9[lVar21] & 0x7fffffff,
                         (uint)pCVar9[lVar21] >> 0x1f);
        lVar21 = lVar21 + 1;
        pCVar9 = (clique->
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      } while (lVar21 < (int)((ulong)((long)(clique->
                                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pCVar9) >> 2));
    }
  }
  else {
    runCliqueSubsumption(this,globaldomain,clique);
    pCVar9 = (clique->
             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pCVar8 = (clique->
             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pCVar9 != pCVar8) {
      lVar21 = (long)pCVar8 - (long)pCVar9 >> 4;
      pCVar11 = pCVar9;
      if (0 < lVar21) {
        pdVar5 = (globaldomain->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar6 = (globaldomain->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pCVar11 = (pointer)((long)&pCVar9->field_0x0 +
                           ((long)pCVar8 - (long)pCVar9 & 0xfffffffffffffff0U));
        lVar21 = lVar21 + 1;
        pCVar9 = pCVar9 + 2;
        do {
          uVar22 = (uint)pCVar9[-2] & 0x7fffffff;
          dVar2 = pdVar5[uVar22];
          if (((dVar2 == pdVar6[uVar22]) && (!NAN(dVar2) && !NAN(pdVar6[uVar22]))) &&
             ((int)dVar2 == ~(uint)pCVar9[-2] >> 0x1f)) {
            pCVar9 = pCVar9 + -2;
            goto LAB_00266dff;
          }
          uVar22 = (uint)pCVar9[-1] & 0x7fffffff;
          dVar2 = pdVar5[uVar22];
          if (((dVar2 == pdVar6[uVar22]) && (!NAN(dVar2) && !NAN(pdVar6[uVar22]))) &&
             ((int)dVar2 == ~(uint)pCVar9[-1] >> 0x1f)) {
            pCVar9 = pCVar9 + -1;
            goto LAB_00266dff;
          }
          uVar22 = (uint)*pCVar9 & 0x7fffffff;
          dVar2 = pdVar5[uVar22];
          if (((dVar2 == pdVar6[uVar22]) && (!NAN(dVar2) && !NAN(pdVar6[uVar22]))) &&
             ((int)dVar2 == ~(uint)*pCVar9 >> 0x1f)) goto LAB_00266dff;
          uVar22 = (uint)pCVar9[1] & 0x7fffffff;
          dVar2 = pdVar5[uVar22];
          if (((dVar2 == pdVar6[uVar22]) && (!NAN(dVar2) && !NAN(pdVar6[uVar22]))) &&
             ((int)dVar2 == ~(uint)pCVar9[1] >> 0x1f)) {
            pCVar9 = pCVar9 + 1;
            goto LAB_00266dff;
          }
          lVar21 = lVar21 + -1;
          pCVar9 = pCVar9 + 4;
        } while (1 < lVar21);
      }
      lVar21 = (long)pCVar8 - (long)pCVar11 >> 2;
      if (lVar21 == 1) {
LAB_00266db1:
        uVar22 = (uint)*pCVar11 & 0x7fffffff;
        dVar2 = (globaldomain->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar22];
        if ((int)dVar2 != ~(uint)*pCVar11 >> 0x1f) {
          pCVar11 = pCVar8;
        }
        pdVar1 = (globaldomain->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar22;
        if (dVar2 != *pdVar1) {
          pCVar11 = pCVar8;
        }
        pCVar9 = pCVar11;
        if (NAN(dVar2) || NAN(*pdVar1)) {
          pCVar9 = pCVar8;
        }
      }
      else if (lVar21 == 2) {
LAB_00266d79:
        uVar22 = (uint)*pCVar11 & 0x7fffffff;
        dVar2 = (globaldomain->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar22];
        pdVar1 = (globaldomain->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar22;
        if (((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) ||
           (pCVar9 = pCVar11, (int)dVar2 != ~(uint)*pCVar11 >> 0x1f)) {
          pCVar11 = pCVar11 + 1;
          goto LAB_00266db1;
        }
      }
      else {
        pCVar9 = pCVar8;
        if (lVar21 == 3) {
          uVar22 = (uint)*pCVar11 & 0x7fffffff;
          dVar2 = (globaldomain->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar22];
          pdVar1 = (globaldomain->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar22;
          if (((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) ||
             (pCVar9 = pCVar11, (int)dVar2 != ~(uint)*pCVar11 >> 0x1f)) {
            pCVar11 = pCVar11 + 1;
            goto LAB_00266d79;
          }
        }
      }
LAB_00266dff:
      pCVar12 = pCVar9;
      if (pCVar9 != pCVar8) {
        while (pCVar12 = pCVar12 + 1, pCVar12 != pCVar8) {
          CVar18 = *pCVar12;
          dVar2 = (globaldomain->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[(uint)CVar18 & 0x7fffffff];
          pdVar1 = (globaldomain->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start + ((uint)CVar18 & 0x7fffffff);
          if (((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) ||
             ((int)dVar2 != ~(uint)CVar18 >> 0x1f)) {
            *pCVar9 = CVar18;
            pCVar9 = pCVar9 + 1;
          }
        }
      }
      pCVar8 = (clique->
               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if ((pCVar9 != pCVar8) &&
         (pCVar11 = (clique->
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    )._M_impl.super__Vector_impl_data._M_finish,
         pCVar9 = (pointer)((long)pCVar9 + ((long)pCVar11 - (long)pCVar8)), pCVar11 != pCVar9)) {
        (clique->
        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
        )._M_impl.super__Vector_impl_data._M_finish = pCVar9;
      }
    }
  }
  processInfeasibleVertices(this,globaldomain);
LAB_00266e7c:
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HighsCliqueTable::runCliqueMerging(HighsDomain& globaldomain,
                                        std::vector<CliqueVar>& clique,
                                        bool equation) {
  CliqueVar extensionstart;
  HighsInt numcliques = kHighsIInf;
  iscandidate.resize(invertedHashList.size());
  std::vector<HighsInt> neighbourhoodInds;
  neighbourhoodInds.reserve(invertedHashList.size());

  HighsInt initialCliqueSize = clique.size();
  for (HighsInt i = 0; i != initialCliqueSize; ++i) {
    if (globaldomain.isFixed(cliqueentries[i].col)) continue;

    HighsInt thisNumClqs = numCliques(clique[i]);
    if (thisNumClqs < numcliques) {
      numcliques = thisNumClqs;
      extensionstart = clique[i];
    }
  }

  if (numcliques == kHighsIInf) {
    clique.clear();
    return;
  }

  for (HighsInt i = 0; i != initialCliqueSize; ++i)
    iscandidate[clique[i].index()] = true;

  auto addCands = [&](HighsInt cliqueid) {
    HighsInt start = cliques[cliqueid].start;
    HighsInt end = cliques[cliqueid].end;

    for (HighsInt i = start; i != end; ++i) {
      if (iscandidate[cliqueentries[i].index()] ||
          globaldomain.isFixed(cliqueentries[i].col))
        continue;

      iscandidate[cliqueentries[i].index()] = true;
      clique.push_back(cliqueentries[i]);
    }
  };

  invertedHashList[extensionstart.index()].for_each(
      [&](HighsInt cliqueid) { addCands(cliqueid); });

  invertedHashListSizeTwo[extensionstart.index()].for_each(
      [&](HighsInt cliqueid) { addCands(cliqueid); });

  HighsInt sizeWithCandidates = clique.size();
  for (HighsInt i = 0; i != sizeWithCandidates; ++i)
    iscandidate[clique[i].index()] = false;

  for (HighsInt i = 0;
       i != initialCliqueSize && initialCliqueSize < (HighsInt)clique.size();
       ++i) {
    if (clique[i] == extensionstart) continue;

    HighsInt newSize =
        initialCliqueSize +
        shrinkToNeighbourhood(neighbourhoodInds, numNeighbourhoodQueries,
                              clique[i], clique.data() + initialCliqueSize,
                              clique.size() - initialCliqueSize);
    clique.erase(clique.begin() + newSize, clique.end());
  }

  if (static_cast<size_t>(initialCliqueSize) < clique.size()) {
    // todo, shuffle extension vars?
    randgen.shuffle(clique.data() + initialCliqueSize,
                    clique.size() - initialCliqueSize);
    HighsInt i = initialCliqueSize;
    while (i < (HighsInt)clique.size()) {
      CliqueVar extvar = clique[i];
      i += 1;

      HighsInt newSize = i + shrinkToNeighbourhood(
                                 neighbourhoodInds, numNeighbourhoodQueries,
                                 extvar, clique.data() + i, clique.size() - i);
      clique.erase(clique.begin() + newSize, clique.end());
    }
  }

  if (equation) {
    for (HighsInt i = initialCliqueSize; i < (HighsInt)clique.size(); ++i)
      vertexInfeasible(globaldomain, clique[i].col, clique[i].val);
  } else {
    runCliqueSubsumption(globaldomain, clique);

    if (!clique.empty()) {
      clique.erase(
          std::remove_if(clique.begin(), clique.end(),
                         [&](CliqueVar v) {
                           return globaldomain.isFixed(v.col) &&
                                  static_cast<int>(
                                      globaldomain.col_lower_[v.col]) ==
                                      static_cast<int>(1 - v.val);
                         }),
          clique.end());
    }
  }

  processInfeasibleVertices(globaldomain);
}